

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
ObjectTest_basic_has_forward_list_Test::ObjectTest_basic_has_forward_list_Test
          (ObjectTest_basic_has_forward_list_Test *this)

{
  ObjectTest_basic_has_forward_list_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__ObjectTest_basic_has_forward_list_Test_0080f3d8;
  return;
}

Assistant:

TEST(ObjectTest, basic_has_forward_list) {
	object obj;

	EXPECT_FALSE(obj.has<std::forward_list<bool>>());
	EXPECT_FALSE(obj.has<std::forward_list<signed char>>());
	EXPECT_FALSE(obj.has<std::forward_list<unsigned char>>());
	EXPECT_FALSE(obj.has<std::forward_list<short>>());
	EXPECT_FALSE(obj.has<std::forward_list<int>>());
	EXPECT_FALSE(obj.has<std::forward_list<long>>());
	EXPECT_FALSE(obj.has<std::forward_list<long long>>());
	EXPECT_FALSE(obj.has<std::forward_list<intmax_t>>());
	EXPECT_FALSE(obj.has<std::forward_list<float>>());
	EXPECT_FALSE(obj.has<std::forward_list<double>>());
	EXPECT_FALSE(obj.has<std::forward_list<long double>>());
	EXPECT_FALSE(obj.has<std::forward_list<std::u8string>>());
	EXPECT_FALSE(obj.has<std::forward_list<object>>());
}